

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphGenerator.cpp
# Opt level: O3

void __thiscall GraphGenerator::Generate(GraphGenerator *this,int n,double density,double eps)

{
  pointer *pppVar1;
  pointer ppVar2;
  iterator __position;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int del;
  uint uVar10;
  pair<int,_int> pVar11;
  pair<int,_int> pVar12;
  ulong uVar13;
  pair<int,_int> local_38;
  
  ppVar2 = (this->edges).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->edges).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->edges).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  if (0 < n) {
    uVar5 = (ulong)(density / eps);
    pVar12.first = 0;
    pVar12.second = 1;
    lVar6 = (long)(1.0 / eps);
    uVar3 = (uint)lVar6 | (uint)(long)(1.0 / eps - 9.223372036854776e+18) & (uint)(lVar6 >> 0x3f);
    uVar10 = -uVar3;
    if (0 < (int)uVar3) {
      uVar10 = uVar3;
    }
    uVar7 = (ulong)(uint)n;
    uVar13 = 1;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + 1;
      uVar9 = uVar7;
      pVar11 = pVar12;
      if (uVar8 < uVar7) {
        do {
          iVar4 = rand();
          if ((ulong)(long)(int)(iVar4 % (int)(uVar10 + 1) + ((int)uVar3 >> 0x1f & uVar3)) <
              ((long)(density / eps - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5)) {
            __position._M_current =
                 (this->edges).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_38 = pVar11;
            if (__position._M_current ==
                (this->edges).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         &this->edges,__position,&local_38);
            }
            else {
              *__position._M_current = pVar11;
              pppVar1 = &(this->edges).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          pVar11 = (pair<int,_int>)((long)pVar11 + 0x100000000);
          uVar9 = uVar9 - 1;
        } while (uVar13 != uVar9);
      }
      uVar13 = uVar13 + 1;
      pVar12 = (pair<int,_int>)((long)pVar12 + 0x100000001);
    } while (uVar8 != uVar7);
  }
  (**this->_vptr_GraphGenerator)(this,(ulong)(uint)n);
  return;
}

Assistant:

void GraphGenerator::Generate(int n, double density, double eps) {
	edges.clear();
	size_t tot = 1 / eps;
	size_t den = density / eps;
	for (int i = 0; i < n; i++) {
		for (int j = i + 1; j < n; j++) {
			size_t cur = randRange(0, tot);
			if (cur < den) edges.push_back(make_pair(i, j));
		}
	}
	this -> output(n);
}